

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O0

QByteArray * Qt::Literals::StringLiterals::operator____ba(char *str,size_t size)

{
  qsizetype in_RDX;
  char *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  DataPointer *in_stack_ffffffffffffffa8;
  QArrayDataPointer<char> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char>::QArrayDataPointer(&local_20,(Data *)0x0,in_RSI,in_RDX);
  QByteArray::QByteArray((QByteArray *)in_RDI,in_stack_ffffffffffffffa8);
  QArrayDataPointer<char>::~QArrayDataPointer(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QByteArray operator""_ba(const char *str, size_t size) noexcept
{
    return QByteArray(QByteArrayData(nullptr, const_cast<char *>(str), qsizetype(size)));
}